

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O0

int bin_mdef_phone_str(bin_mdef_t *m,int pid,char *buf)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *wpos_name;
  char *buf_local;
  int pid_local;
  bin_mdef_t *m_local;
  
  if (m == (bin_mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                  ,0x364,"int bin_mdef_phone_str(bin_mdef_t *, int, char *)");
  }
  if ((-1 < pid) && (pid < m->n_phone)) {
    *buf = '\0';
    if (pid < m->n_ciphone) {
      pcVar1 = bin_mdef_ciphone_str(m,pid);
      sprintf(buf,"%s",pcVar1);
    }
    else {
      pcVar1 = bin_mdef_ciphone_str(m,(uint)m->phone[pid].info.ci.reserved[0]);
      pcVar2 = bin_mdef_ciphone_str(m,(uint)m->phone[pid].info.ci.reserved[1]);
      pcVar3 = bin_mdef_ciphone_str(m,(uint)m->phone[pid].info.ci.reserved[2]);
      sprintf(buf,"%s %s %s %c",pcVar1,pcVar2,pcVar3,
              (ulong)(uint)(int)"ibesu"[m->phone[pid].info.ci.filler]);
    }
    return 0;
  }
  __assert_fail("(pid >= 0) && (pid < m->n_phone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0x365,"int bin_mdef_phone_str(bin_mdef_t *, int, char *)");
}

Assistant:

int
bin_mdef_phone_str(bin_mdef_t * m, int pid, char *buf)
{
    char *wpos_name;

    assert(m);
    assert((pid >= 0) && (pid < m->n_phone));
    wpos_name = WPOS_NAME;

    buf[0] = '\0';
    if (pid < m->n_ciphone)
        sprintf(buf, "%s", bin_mdef_ciphone_str(m, pid));
    else {
        sprintf(buf, "%s %s %s %c",
                bin_mdef_ciphone_str(m, m->phone[pid].info.cd.ctx[0]),
                bin_mdef_ciphone_str(m, m->phone[pid].info.cd.ctx[1]),
                bin_mdef_ciphone_str(m, m->phone[pid].info.cd.ctx[2]),
                wpos_name[m->phone[pid].info.cd.wpos]);
    }
    return 0;
}